

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O2

int check_memory(unsigned_long value,unsigned_long check_value_data)

{
  int iVar1;
  
  _assert_true(check_value_data,"check",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
               ,0x632);
  iVar1 = memory_equal_display_error
                    ((char *)value,*(char **)(check_value_data + 0x28),
                     *(size_t *)(check_value_data + 0x30));
  return iVar1;
}

Assistant:

static int check_memory(const LargestIntegralType value,
                        const LargestIntegralType check_value_data) {
    CheckMemoryData * const check = cast_largest_integral_type_to_pointer(
        CheckMemoryData*, check_value_data);
    assert_non_null(check);
    return memory_equal_display_error(
        cast_largest_integral_type_to_pointer(const char*, value),
        (const char*)check->memory, check->size);
}